

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall t_cpp_generator::close_generator(t_cpp_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  ofstream_with_content_based_conditional_update *this_01;
  ostream *poVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  int __fd;
  _Alloc_hider _Var5;
  string f_types_impl_name;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = &this->f_types_;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,(this->ns_close_)._M_dataplus._M_p,
                      (this->ns_close_)._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_impl_,(this->ns_close_)._M_dataplus._M_p,
                      (this->ns_close_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  this_01 = &this->f_types_tcc_;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_01,(this->ns_close_)._M_dataplus._M_p,
                      (this->ns_close_)._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (this->gen_templates_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include \"",10);
    get_include_prefix_abi_cxx11_
              (&local_88,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,local_88._M_dataplus._M_p,local_88._M_string_length);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_types.tcc\"",0xb);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#endif",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"#endif",6);
  _Var5 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  __fd = (int)_Var5._M_p;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_impl_,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_01,__fd);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_48,this);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_48,
                              (ulong)(this->super_t_oop_generator).super_t_generator.program_name_.
                                     _M_dataplus._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_88.field_2._M_allocated_capacity = *psVar4;
    local_88.field_2._8_8_ = plVar2[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar4;
    local_88._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_88._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (this->has_members_ == false) {
    remove(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::close_generator() {
  // Close namespace
  f_types_ << ns_close_ << endl << endl;
  f_types_impl_ << ns_close_ << endl;
  f_types_tcc_ << ns_close_ << endl << endl;

  // Include the types.tcc file from the types header file,
  // so clients don't have to explicitly include the tcc file.
  // TODO(simpkins): Make this a separate option.
  if (gen_templates_) {
    f_types_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
             << "_types.tcc\"" << endl << endl;
  }

  // Close ifndef
  f_types_ << "#endif" << endl;
  f_types_tcc_ << "#endif" << endl;

  // Close output file
  f_types_.close();
  f_types_impl_.close();
  f_types_tcc_.close();

  string f_types_impl_name = get_out_dir() + program_name_ + "_types.cpp";

  if (!has_members_) {
    remove(f_types_impl_name.c_str());
  }
}